

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void kratos::track_generators(Generator *top)

{
  bool bVar1;
  Context *pCVar2;
  undefined1 local_80 [8];
  MarkTrackedVisitor track_visitor;
  Generator *top_local;
  
  track_visitor.track_lock_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)top;
  pCVar2 = Generator::context(top);
  if (pCVar2 != (Context *)0x0) {
    pCVar2 = Generator::context((Generator *)
                                track_visitor.track_lock_.super___mutex_base._M_mutex.__data.__list.
                                __next);
    bVar1 = Context::track_generated(pCVar2);
    if (bVar1) {
      MarkTrackedVisitor::MarkTrackedVisitor((MarkTrackedVisitor *)local_80);
      IRVisitor::visit_generator_root_p
                ((IRVisitor *)local_80,
                 (Generator *)
                 track_visitor.track_lock_.super___mutex_base._M_mutex.__data.__list.__next);
      MarkTrackedVisitor::~MarkTrackedVisitor((MarkTrackedVisitor *)local_80);
    }
  }
  return;
}

Assistant:

void track_generators(Generator* top) {
    // if we need to track if a generator has been touched for verilog
    if (top->context() && top->context()->track_generated()) {
        MarkTrackedVisitor track_visitor;
        track_visitor.visit_generator_root_p(top);
    }
}